

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

addrinfo * Jupiter::Socket::getAddrInfo(addrinfo *addr,uint result)

{
  addrinfo *ptr;
  bool bVar1;
  
  while( true ) {
    bVar1 = result == 0;
    result = result - 1;
    if ((addr == (addrinfo *)0x0) || (bVar1)) break;
    addr = addr->ai_next;
  }
  return addr;
}

Assistant:

addrinfo *Jupiter::Socket::getAddrInfo(addrinfo *addr, unsigned int result) { // static
	addrinfo* ptr = addr;
	while (ptr != nullptr && result != 0) {
		ptr = ptr->ai_next;
		--result;
	}

	return ptr;
}